

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

void clear_all(hash_table *p_hash_table)

{
  long *in_RDI;
  int i;
  Vector *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if (*in_RDI != 0) {
    for (iVar1 = 0; iVar1 < 0x80000; iVar1 = iVar1 + 1) {
      if (*(long *)(*in_RDI + (long)iVar1 * 8) != 0) {
        aom_vector_destroy(in_stack_ffffffffffffffe8);
        aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
        *(undefined8 *)(*in_RDI + (long)iVar1 * 8) = 0;
      }
    }
  }
  return;
}

Assistant:

static void clear_all(hash_table *p_hash_table) {
  if (p_hash_table->p_lookup_table == NULL) {
    return;
  }
  for (int i = 0; i < kMaxAddr; i++) {
    if (p_hash_table->p_lookup_table[i] != NULL) {
      aom_vector_destroy(p_hash_table->p_lookup_table[i]);
      aom_free(p_hash_table->p_lookup_table[i]);
      p_hash_table->p_lookup_table[i] = NULL;
    }
  }
}